

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_split(REF_SHARD ref_shard)

{
  REF_GRID_conflict pRVar1;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_CELL ref_cell_01;
  REF_STATUS RVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  uint unaff_R14D;
  REF_BOOL marked;
  REF_INT new_cell;
  REF_INT pri_nodes [6];
  REF_INT tri_nodes [4];
  REF_INT qua_nodes [5];
  REF_INT hex_nodes [27];
  int local_110;
  REF_INT local_10c;
  REF_INT local_108;
  REF_INT RStack_104;
  REF_INT RStack_100;
  REF_INT RStack_fc;
  REF_INT RStack_f8;
  REF_INT local_f4;
  REF_CELL local_e8;
  REF_SHARD local_e0;
  REF_INT local_d8;
  REF_INT RStack_d4;
  undefined4 uStack_cc;
  REF_INT local_c8;
  REF_INT RStack_c4;
  REF_INT RStack_c0;
  REF_INT RStack_bc;
  undefined4 uStack_b8;
  REF_INT local_a8;
  REF_INT RStack_a4;
  REF_INT RStack_a0;
  REF_INT RStack_9c;
  REF_INT RStack_98;
  REF_INT RStack_94;
  REF_INT local_90;
  REF_INT RStack_8c;
  
  pRVar1 = ref_shard->grid;
  ref_cell = pRVar1->cell[0xb];
  local_e8 = pRVar1->cell[10];
  ref_cell_00 = pRVar1->cell[6];
  local_e0 = ref_shard;
  if (0 < ref_cell_00->max) {
    ref_cell_01 = pRVar1->cell[3];
    iVar5 = 0;
    do {
      RVar2 = ref_cell_nodes(ref_cell_00,iVar5,&local_c8);
      if (RVar2 == 0) {
        uVar3 = ref_shard_marked(local_e0,local_c8,RStack_c0,&local_110);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x11a,"ref_shard_split",(ulong)uVar3,"0-2");
          return uVar3;
        }
        if (local_110 != 0) {
          uVar3 = ref_cell_remove(ref_cell_00,iVar5);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x11c,"ref_shard_split",(ulong)uVar3,"remove qua");
            return uVar3;
          }
          local_d8 = local_c8;
          uStack_cc = uStack_b8;
          uVar3 = ref_cell_add(ref_cell_01,&local_d8,&local_10c);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x121,"ref_shard_split",(ulong)uVar3,"add tri");
            return uVar3;
          }
          local_d8 = local_c8;
          RStack_d4 = RStack_c0;
          uVar3 = ref_cell_add(ref_cell_01,&local_d8,&local_10c);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x126,"ref_shard_split",(ulong)uVar3,"add tri");
            return uVar3;
          }
        }
        uVar3 = ref_shard_marked(local_e0,RStack_c4,RStack_bc,&local_110);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x129,"ref_shard_split",(ulong)uVar3,"1-3");
          return uVar3;
        }
        if (local_110 != 0) {
          uVar3 = ref_cell_remove(ref_cell_00,iVar5);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,299,"ref_shard_split",(ulong)uVar3,"remove qua");
            return uVar3;
          }
          uVar3 = ref_cell_add(ref_cell_01,&local_d8,&local_10c);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x130,"ref_shard_split",(ulong)uVar3,"add tri");
            return uVar3;
          }
          local_d8 = RStack_c4;
          RStack_d4 = RStack_c0;
          uVar3 = ref_cell_add(ref_cell_01,&local_d8,&local_10c);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x135,"ref_shard_split",(ulong)uVar3,"add tri");
            return uVar3;
          }
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < ref_cell_00->max);
  }
  if (0 < ref_cell->max) {
    iVar5 = 0;
    do {
      RVar2 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
      if (RVar2 == 0) {
        uVar3 = ref_shard_marked(local_e0,RStack_a4,RStack_98,&local_110);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x13b,"ref_shard_split",(ulong)uVar3,"1-4");
          return uVar3;
        }
        if (local_110 == 0) {
          uVar3 = ref_shard_marked(local_e0,local_a8,RStack_94,&local_110);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x14f,"ref_shard_split",(ulong)uVar3,"0-5");
            return uVar3;
          }
          if (local_110 == 0) {
            uVar3 = ref_shard_marked(local_e0,RStack_a4,local_90,&local_110);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x164,"ref_shard_split",(ulong)uVar3,"1-6");
              return uVar3;
            }
            if (local_110 == 0) {
              uVar3 = ref_shard_marked(local_e0,RStack_a0,RStack_94,&local_110);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x178,"ref_shard_split",(ulong)uVar3,"2-5");
                return uVar3;
              }
              if (local_110 == 0) {
                uVar3 = ref_shard_marked(local_e0,local_a8,RStack_a0,&local_110);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x18d,"ref_shard_split",(ulong)uVar3,"0-2");
                  return uVar3;
                }
                if (local_110 == 0) {
                  uVar3 = ref_shard_marked(local_e0,RStack_a4,RStack_9c,&local_110);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x1a2,"ref_shard_split",(ulong)uVar3,"1-3");
                    return uVar3;
                  }
                  if (local_110 == 0) goto LAB_001a7d9a;
                  uVar3 = ref_cell_remove(ref_cell,iVar5);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x1a4,"ref_shard_split",(ulong)uVar3,"remove hex");
                    return uVar3;
                  }
                  RStack_100 = RStack_9c;
                  local_f4 = RStack_8c;
                  uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x1ab,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
                    return uVar3;
                  }
                  local_108 = RStack_a4;
                  RStack_104 = RStack_a0;
                  RStack_100 = RStack_9c;
                  RStack_fc = RStack_94;
                  RStack_f8 = local_90;
                  local_f4 = RStack_8c;
                  uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
                  if (uVar3 != 0) {
                    uVar4 = 0x1b2;
                    goto LAB_001a7d7b;
                  }
                }
                else {
                  uVar3 = ref_cell_remove(ref_cell,iVar5);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,399,"ref_shard_split",(ulong)uVar3,"remove hex");
                    return uVar3;
                  }
                  local_108 = local_a8;
                  RStack_fc = RStack_98;
                  uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x196,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
                    return uVar3;
                  }
                  local_108 = local_a8;
                  RStack_104 = RStack_a0;
                  RStack_100 = RStack_9c;
                  RStack_fc = RStack_98;
                  RStack_f8 = local_90;
                  local_f4 = RStack_8c;
                  uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
                  if (uVar3 != 0) {
                    uVar4 = 0x19d;
                    goto LAB_001a7d7b;
                  }
                }
              }
              else {
                uVar3 = ref_cell_remove(ref_cell,iVar5);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x17a,"ref_shard_split",(ulong)uVar3,"remove hex");
                  return uVar3;
                }
                local_108 = RStack_a4;
                RStack_104 = RStack_94;
                RStack_100 = RStack_a0;
                RStack_fc = local_a8;
                uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x181,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
                  return uVar3;
                }
                local_108 = RStack_a0;
                RStack_104 = RStack_94;
                RStack_100 = local_90;
                RStack_fc = RStack_9c;
                RStack_f8 = RStack_98;
                local_f4 = RStack_8c;
                uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
                if (uVar3 != 0) {
                  uVar4 = 0x188;
                  pcVar6 = "add hex pri 2";
                  goto LAB_001a7d88;
                }
              }
            }
            else {
              uVar3 = ref_cell_remove(ref_cell,iVar5);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x166,"ref_shard_split",(ulong)uVar3,"remove hex");
                return uVar3;
              }
              local_108 = RStack_a4;
              RStack_fc = local_a8;
              RStack_f8 = RStack_98;
              local_f4 = RStack_8c;
              uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x16d,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
                return uVar3;
              }
              local_108 = RStack_a4;
              RStack_104 = local_90;
              RStack_100 = RStack_a0;
              RStack_fc = local_a8;
              RStack_f8 = RStack_8c;
              local_f4 = RStack_9c;
              uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
              if (uVar3 != 0) {
                uVar4 = 0x174;
                goto LAB_001a7d7b;
              }
            }
          }
          else {
            uVar3 = ref_cell_remove(ref_cell,iVar5);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x151,"ref_shard_split",(ulong)uVar3,"remove hex");
              return uVar3;
            }
            local_108 = local_a8;
            RStack_104 = RStack_94;
            RStack_100 = RStack_a4;
            RStack_fc = RStack_9c;
            RStack_f8 = local_90;
            local_f4 = RStack_a0;
            uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x158,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
              return uVar3;
            }
            local_108 = RStack_98;
            RStack_104 = RStack_94;
            RStack_100 = local_a8;
            RStack_fc = RStack_8c;
            RStack_f8 = local_90;
            local_f4 = RStack_9c;
            uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
            if (uVar3 != 0) {
              uVar4 = 0x15f;
              goto LAB_001a7d7b;
            }
          }
        }
        else {
          uVar3 = ref_cell_remove(ref_cell,iVar5);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x13d,"ref_shard_split",(ulong)uVar3,"remove hex");
            return uVar3;
          }
          local_108 = RStack_a4;
          RStack_104 = local_a8;
          RStack_100 = RStack_98;
          local_f4 = RStack_8c;
          uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x144,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
            return uVar3;
          }
          local_108 = RStack_a4;
          RStack_104 = RStack_98;
          RStack_100 = RStack_94;
          RStack_fc = RStack_a0;
          RStack_f8 = RStack_8c;
          local_f4 = local_90;
          uVar3 = ref_cell_add(local_e8,&local_108,&local_10c);
          if (uVar3 != 0) {
            uVar4 = 0x14b;
LAB_001a7d7b:
            pcVar6 = "add hex_pri 2";
LAB_001a7d88:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,uVar4,"ref_shard_split",(ulong)uVar3,pcVar6);
            unaff_R14D = uVar3;
          }
        }
        if (uVar3 != 0) {
          return unaff_R14D;
        }
      }
LAB_001a7d9a:
      iVar5 = iVar5 + 1;
    } while (iVar5 < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_shard_split(REF_SHARD ref_shard) {
  REF_GRID ref_grid;
  REF_CELL hex, pri, tri, qua;
  REF_INT cell, hex_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[6], new_cell;
  REF_INT tri_nodes[4], qua_nodes[5];
  REF_BOOL marked;

  ref_grid = ref_shard_grid(ref_shard);
  hex = ref_grid_hex(ref_grid);
  pri = ref_grid_pri(ref_grid);
  tri = ref_grid_tri(ref_grid);
  qua = ref_grid_qua(ref_grid);

  each_ref_cell_valid_cell_with_nodes(qua, cell, qua_nodes) {
    RSS(ref_shard_marked(ref_shard, qua_nodes[0], qua_nodes[2], &marked),
        "0-2");
    if (marked) {
      RSS(ref_cell_remove(qua, cell), "remove qua");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[2];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
    }
    RSS(ref_shard_marked(ref_shard, qua_nodes[1], qua_nodes[3], &marked),
        "1-3");
    if (marked) {
      RSS(ref_cell_remove(qua, cell), "remove qua");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
      tri_nodes[0] = qua_nodes[1];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
    }
  }

  each_ref_cell_valid_cell_with_nodes(hex, cell, hex_nodes) {
    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[4], &marked),
        "1-4");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[0];
      pri_nodes[2] = hex_nodes[4];
      pri_nodes[3] = hex_nodes[2];
      pri_nodes[4] = hex_nodes[3];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[4];
      pri_nodes[2] = hex_nodes[5];
      pri_nodes[3] = hex_nodes[2];
      pri_nodes[4] = hex_nodes[7];
      pri_nodes[5] = hex_nodes[6];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[5], &marked),
        "0-5");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[1];
      pri_nodes[3] = hex_nodes[3];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[2];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[4];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[0];
      pri_nodes[3] = hex_nodes[7];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[6], &marked),
        "1-6");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[6];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[6];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[7];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
    RSS(ref_shard_marked(ref_shard, hex_nodes[2], hex_nodes[5], &marked),
        "2-5");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[2];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[6];
      pri_nodes[3] = hex_nodes[3];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[2], &marked),
        "0-2");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[1];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[5];
      pri_nodes[5] = hex_nodes[6];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[2];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[3], &marked),
        "1-3");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[1];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[5];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[2];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[5];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
  }

  return REF_SUCCESS;
}